

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplex.cpp
# Opt level: O3

void setSolutionStatus(HighsInfo *highs_info)

{
  int iVar1;
  
  iVar1 = (highs_info->super_HighsInfoStruct).num_primal_infeasibilities;
  if (iVar1 < 0) {
    (highs_info->super_HighsInfoStruct).primal_solution_status = 0;
  }
  else if (iVar1 == 0) {
    (highs_info->super_HighsInfoStruct).primal_solution_status = 2;
  }
  else {
    (highs_info->super_HighsInfoStruct).primal_solution_status = 1;
  }
  iVar1 = (highs_info->super_HighsInfoStruct).num_dual_infeasibilities;
  if (-1 < iVar1) {
    if (iVar1 != 0) {
      (highs_info->super_HighsInfoStruct).dual_solution_status = 1;
      return;
    }
    (highs_info->super_HighsInfoStruct).dual_solution_status = 2;
    return;
  }
  (highs_info->super_HighsInfoStruct).dual_solution_status = 0;
  return;
}

Assistant:

void setSolutionStatus(HighsInfo& highs_info) {
  if (highs_info.num_primal_infeasibilities < 0) {
    highs_info.primal_solution_status = kSolutionStatusNone;
  } else if (highs_info.num_primal_infeasibilities == 0) {
    highs_info.primal_solution_status = kSolutionStatusFeasible;
  } else {
    highs_info.primal_solution_status = kSolutionStatusInfeasible;
  }
  if (highs_info.num_dual_infeasibilities < 0) {
    highs_info.dual_solution_status = kSolutionStatusNone;
  } else if (highs_info.num_dual_infeasibilities == 0) {
    highs_info.dual_solution_status = kSolutionStatusFeasible;
  } else {
    highs_info.dual_solution_status = kSolutionStatusInfeasible;
  }
}